

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall
flatbuffers::Parser::TryTypedValue(Parser *this,int dtoken,bool check,Value *e,BaseType req)

{
  int iVar1;
  long *plVar2;
  undefined8 extraout_RAX;
  long *plVar3;
  size_type *psVar4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar1 = this->token_;
  if (iVar1 == dtoken) {
    std::__cxx11::string::_M_assign((string *)&e->constant);
    if (!check) {
      if ((e->type).base_type != BASE_TYPE_NONE) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"type mismatch: expecting: ","");
        plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
        local_b0 = (long *)*plVar2;
        plVar3 = plVar2 + 2;
        if (local_b0 == plVar3) {
          local_a0 = *plVar3;
          lStack_98 = plVar2[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar3;
        }
        local_a8 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_90 = (long *)*plVar2;
        plVar3 = plVar2 + 2;
        if (local_90 == plVar3) {
          local_80 = *plVar3;
          lStack_78 = plVar2[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar3;
        }
        local_88 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_70._M_dataplus._M_p = (pointer)*plVar2;
        psVar4 = (size_type *)(plVar2 + 2);
        if ((size_type *)local_70._M_dataplus._M_p == psVar4) {
          local_70.field_2._M_allocated_capacity = *psVar4;
          local_70.field_2._8_8_ = plVar2[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar4;
        }
        local_70._M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        Error(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        _Unwind_Resume(extraout_RAX);
      }
      (e->type).base_type = req;
    }
    Next(this);
  }
  return iVar1 == dtoken;
}

Assistant:

bool Parser::TryTypedValue(int dtoken,
                           bool check,
                           Value &e,
                           BaseType req) {
  bool match = dtoken == token_;
  if (match) {
    e.constant = attribute_;
    if (!check) {
      if (e.type.base_type == BASE_TYPE_NONE) {
        e.type.base_type = req;
      } else {
        Error(std::string("type mismatch: expecting: ") +
              kTypeNames[e.type.base_type] +
              ", found: " +
              kTypeNames[req]);
      }
    }
    Next();
  }
  return match;
}